

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtwister.c
# Opt level: O0

unsigned_long genRandLong(MTRand *rand)

{
  int iVar1;
  ulong uVar2;
  MTRand *in_RDI;
  int kk;
  unsigned_long y;
  int local_14;
  
  if ((0x26f < in_RDI->index) || (in_RDI->index < 0)) {
    if ((0x270 < in_RDI->index) || (in_RDI->index < 0)) {
      m_seedRand(in_RDI,0x1105);
    }
    for (local_14 = 0; local_14 < 0xe3; local_14 = local_14 + 1) {
      in_RDI->mt[local_14] =
           in_RDI->mt[local_14 + 0x18d] ^
           (in_RDI->mt[local_14] & 0x80000000 | in_RDI->mt[local_14 + 1] & 0x7fffffff) >> 1 ^
           genRandLong::mag[in_RDI->mt[local_14 + 1] & 1];
    }
    for (; local_14 < 0x26f; local_14 = local_14 + 1) {
      in_RDI->mt[local_14] =
           in_RDI->mt[local_14 + -0xe3] ^
           (in_RDI->mt[local_14] & 0x80000000 | in_RDI->mt[local_14 + 1] & 0x7fffffff) >> 1 ^
           genRandLong::mag[in_RDI->mt[local_14 + 1] & 1];
    }
    in_RDI->mt[0x26f] =
         in_RDI->mt[0x18c] ^ (in_RDI->mt[0x26f] & 0x80000000 | in_RDI->mt[0] & 0x7fffffff) >> 1 ^
         genRandLong::mag[in_RDI->mt[0] & 1];
    in_RDI->index = 0;
  }
  iVar1 = in_RDI->index;
  in_RDI->index = iVar1 + 1;
  uVar2 = in_RDI->mt[iVar1] >> 0xb ^ in_RDI->mt[iVar1];
  uVar2 = (uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = (uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

unsigned long genRandLong(MTRand *rand) {

    unsigned long y;
    static unsigned long mag[2] = {0x0, 0x9908b0df}; /* mag[x] = x * 0x9908b0df for x = 0,1 */
    if (rand->index >= STATE_VECTOR_LENGTH || rand->index < 0) {
        /* generate STATE_VECTOR_LENGTH words at a time */
        int kk;
        if (rand->index >= STATE_VECTOR_LENGTH + 1 || rand->index < 0) {
            m_seedRand(rand, 4357);
        }
        for (kk = 0; kk < STATE_VECTOR_LENGTH - STATE_VECTOR_M; kk++) {
            y = (rand->mt[kk] & UPPER_MASK) | (rand->mt[kk + 1] & LOWER_MASK);
            rand->mt[kk] = rand->mt[kk + STATE_VECTOR_M] ^ (y >> 1) ^ mag[y & 0x1];
        }
        for (; kk < STATE_VECTOR_LENGTH - 1; kk++) {
            y = (rand->mt[kk] & UPPER_MASK) | (rand->mt[kk + 1] & LOWER_MASK);
            rand->mt[kk] = rand->mt[kk + (STATE_VECTOR_M - STATE_VECTOR_LENGTH)] ^ (y >> 1) ^ mag[y & 0x1];
        }
        y = (rand->mt[STATE_VECTOR_LENGTH - 1] & UPPER_MASK) | (rand->mt[0] & LOWER_MASK);
        rand->mt[STATE_VECTOR_LENGTH - 1] = rand->mt[STATE_VECTOR_M - 1] ^ (y >> 1) ^ mag[y & 0x1];
        rand->index = 0;
    }
    y = rand->mt[rand->index++];
    y ^= (y >> 11);
    y ^= (y << 7) & TEMPERING_MASK_B;
    y ^= (y << 15) & TEMPERING_MASK_C;
    y ^= (y >> 18);
    return y;
}